

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

path * AbsPathForConfigVal(path *__return_storage_ptr__,ArgsManager *args,path *path,
                          bool net_specific)

{
  char cVar1;
  long in_FS_OFFSET;
  path pStack_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar1 == '\0') {
    ArgsManager::GetDataDir((path *)&pStack_58,args,net_specific);
    fsbridge::AbsPathJoin(__return_storage_ptr__,(path *)&pStack_58,path);
    std::filesystem::__cxx11::path::~path(&pStack_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00695ae6;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00695ae6:
      __stack_chk_fail();
    }
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&path->super_path);
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path AbsPathForConfigVal(const ArgsManager& args, const fs::path& path, bool net_specific)
{
    if (path.is_absolute()) {
        return path;
    }
    return fsbridge::AbsPathJoin(net_specific ? args.GetDataDirNet() : args.GetDataDirBase(), path);
}